

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O0

void __thiscall Imf_3_3::InputFile::Data::lockedSetFrameBuffer(Data *this,FrameBuffer *frameBuffer)

{
  PixelType PVar1;
  long lVar2;
  size_t xst;
  bool bVar3;
  uint uVar4;
  int iVar5;
  char *__s1;
  char *__s2;
  Slice *pSVar6;
  pointer pcVar7;
  Data *in_RDI;
  int in_stack_0000000c;
  TiledInputFile *in_stack_00000010;
  int in_stack_0000001c;
  Context *in_stack_00000020;
  FrameBuffer *in_stack_00000078;
  CompositeDeepScanLine *in_stack_00000080;
  FrameBuffer *in_stack_000000b8;
  ScanLineInputFile *in_stack_000000c0;
  uint64_t tilebytes;
  uint64_t offset;
  uint64_t bytes;
  Slice s;
  ConstIterator k;
  uint64_t tileRowSize;
  exr_attr_box2i_t dataWindow;
  int partidx;
  ConstIterator j;
  ConstIterator i;
  FrameBuffer *oldFrameBuffer;
  undefined4 in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  vector<std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::allocator<std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>
  *in_stack_fffffffffffffe60;
  size_t in_stack_fffffffffffffe68;
  bool local_145;
  bool local_131;
  Slice local_120;
  long local_d0;
  long local_c8;
  size_t local_c0;
  PixelType local_b8 [10];
  double local_90;
  const_iterator local_80;
  const_iterator local_78;
  long local_70;
  exr_attr_box2i_t local_64;
  int local_54;
  const_iterator local_48;
  const_iterator local_40;
  const_iterator local_38;
  const_iterator local_30;
  const_iterator local_28;
  const_iterator local_20;
  FrameBuffer *local_18;
  
  if (in_RDI->_storage == EXR_STORAGE_TILED) {
    local_18 = &in_RDI->_cacheFrameBuffer;
    local_20._M_node =
         (_Base_ptr)
         FrameBuffer::begin((FrameBuffer *)
                            CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    local_28._M_node =
         (_Base_ptr)
         FrameBuffer::begin((FrameBuffer *)
                            CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    while( true ) {
      local_30._M_node =
           (_Base_ptr)
           FrameBuffer::end((FrameBuffer *)
                            CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      bVar3 = Imf_3_3::operator!=((ConstIterator *)
                                  CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                                  (ConstIterator *)
                                  CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      local_131 = false;
      if (bVar3) {
        local_38._M_node =
             (_Base_ptr)
             FrameBuffer::end((FrameBuffer *)
                              CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        local_131 = Imf_3_3::operator!=((ConstIterator *)
                                        CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50
                                                ),
                                        (ConstIterator *)
                                        CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48
                                                ));
      }
      if (local_131 == false) break;
      __s1 = FrameBuffer::ConstIterator::name((ConstIterator *)0x909fd8);
      __s2 = FrameBuffer::ConstIterator::name((ConstIterator *)0x909fea);
      iVar5 = strcmp(__s1,__s2);
      if (iVar5 != 0) break;
      pSVar6 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x90a009);
      PVar1 = pSVar6->type;
      pSVar6 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x90a01c);
      if (PVar1 != pSVar6->type) break;
      FrameBuffer::ConstIterator::operator++
                ((ConstIterator *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
      FrameBuffer::ConstIterator::operator++
                ((ConstIterator *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    }
    local_40._M_node =
         (_Base_ptr)
         FrameBuffer::end((FrameBuffer *)
                          CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    bVar3 = Imf_3_3::operator!=((ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                                (ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    local_145 = true;
    if (!bVar3) {
      local_48._M_node =
           (_Base_ptr)
           FrameBuffer::end((FrameBuffer *)
                            CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      local_145 = Imf_3_3::operator!=((ConstIterator *)
                                      CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                                      (ConstIterator *)
                                      CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48))
      ;
    }
    if (local_145 != false) {
      deleteCachedBuffer((Data *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
      std::make_unique<Imf_3_3::FrameBuffer>();
      std::unique_ptr<Imf_3_3::FrameBuffer,_std::default_delete<Imf_3_3::FrameBuffer>_>::operator=
                ((unique_ptr<Imf_3_3::FrameBuffer,_std::default_delete<Imf_3_3::FrameBuffer>_> *)
                 CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (unique_ptr<Imf_3_3::FrameBuffer,_std::default_delete<Imf_3_3::FrameBuffer>_> *)
                 CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      std::unique_ptr<Imf_3_3::FrameBuffer,_std::default_delete<Imf_3_3::FrameBuffer>_>::~unique_ptr
                ((unique_ptr<Imf_3_3::FrameBuffer,_std::default_delete<Imf_3_3::FrameBuffer>_> *)
                 CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
      local_54 = getPartIdx(in_RDI);
      local_64 = Context::dataWindow(in_stack_00000020,in_stack_0000001c);
      in_RDI->_cachedOffset = local_64.min.x;
      std::unique_ptr<Imf_3_3::TiledInputFile,_std::default_delete<Imf_3_3::TiledInputFile>_>::
      operator->((unique_ptr<Imf_3_3::TiledInputFile,_std::default_delete<Imf_3_3::TiledInputFile>_>
                  *)0x90a159);
      uVar4 = TiledInputFile::tileYSize((TiledInputFile *)0x90a161);
      local_70 = (ulong)uVar4 * ((long)(local_64.max.x - local_64.min.x) + 1);
      local_78._M_node =
           (_Base_ptr)
           FrameBuffer::begin((FrameBuffer *)
                              CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      while( true ) {
        local_80._M_node =
             (_Base_ptr)
             FrameBuffer::end((FrameBuffer *)
                              CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        bVar3 = Imf_3_3::operator!=((ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                                    (ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        if (!bVar3) break;
        pSVar6 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x90a1d9);
        memcpy(local_b8,pSVar6,0x38);
        FrameBuffer::ConstIterator::name((ConstIterator *)0x90a217);
        bVar3 = Context::hasChannel((Context *)
                                    CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                                    in_stack_fffffffffffffe4c,(char *)0x90a228);
        if (bVar3) {
          local_c0 = (ulong)(local_b8[0] != HALF) * 2 + 2;
          local_c8 = local_c0 * (long)in_RDI->_cachedOffset;
          local_d0 = local_c0 * local_70;
          std::make_unique<char[]>(in_stack_fffffffffffffe68);
          std::
          vector<std::unique_ptr<char[],std::default_delete<char[]>>,std::allocator<std::unique_ptr<char[],std::default_delete<char[]>>>>
          ::emplace_back<std::unique_ptr<char[],std::default_delete<char[]>>>
                    (in_stack_fffffffffffffe60,
                     (unique_ptr<char[],_std::default_delete<char[]>_> *)
                     CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
          std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
                    ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                     CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
          std::unique_ptr<Imf_3_3::FrameBuffer,_std::default_delete<Imf_3_3::FrameBuffer>_>::
          operator->((unique_ptr<Imf_3_3::FrameBuffer,_std::default_delete<Imf_3_3::FrameBuffer>_> *
                     )0x90a2e4);
          FrameBuffer::ConstIterator::name((ConstIterator *)0x90a2f6);
          PVar1 = local_b8[0];
          std::
          vector<std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::allocator<std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>
          ::back((vector<std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::allocator<std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
          pcVar7 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                             ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                              CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
          xst = local_c0;
          lVar2 = -local_c8;
          in_stack_fffffffffffffe68 = local_c0;
          std::unique_ptr<Imf_3_3::TiledInputFile,_std::default_delete<Imf_3_3::TiledInputFile>_>::
          operator->((unique_ptr<Imf_3_3::TiledInputFile,_std::default_delete<Imf_3_3::TiledInputFile>_>
                      *)0x90a35f);
          iVar5 = TiledInputFile::levelWidth(in_stack_00000010,in_stack_0000000c);
          in_stack_fffffffffffffe48 = 1;
          in_stack_fffffffffffffe50 = 0;
          in_stack_fffffffffffffe58 = 1;
          Slice::Slice(&local_120,PVar1,pcVar7 + lVar2,xst,in_stack_fffffffffffffe68 * (long)iVar5,1
                       ,1,local_90,false,true);
          FrameBuffer::insert((FrameBuffer *)s._0_8_,(char *)bytes,(Slice *)offset);
        }
        FrameBuffer::ConstIterator::operator++
                  ((ConstIterator *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
      }
    }
    FrameBuffer::operator=
              ((FrameBuffer *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
               (FrameBuffer *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  }
  else if ((in_RDI->_storage == EXR_STORAGE_DEEP_SCANLINE) ||
          (in_RDI->_storage == EXR_STORAGE_DEEP_TILED)) {
    bVar3 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<Imf_3_3::CompositeDeepScanLine,_std::default_delete<Imf_3_3::CompositeDeepScanLine>_>
                        *)0x90a45a);
    if (!bVar3) {
      std::make_unique<Imf_3_3::CompositeDeepScanLine>();
      std::
      unique_ptr<Imf_3_3::CompositeDeepScanLine,_std::default_delete<Imf_3_3::CompositeDeepScanLine>_>
      ::operator=((unique_ptr<Imf_3_3::CompositeDeepScanLine,_std::default_delete<Imf_3_3::CompositeDeepScanLine>_>
                   *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                  (unique_ptr<Imf_3_3::CompositeDeepScanLine,_std::default_delete<Imf_3_3::CompositeDeepScanLine>_>
                   *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      std::
      unique_ptr<Imf_3_3::CompositeDeepScanLine,_std::default_delete<Imf_3_3::CompositeDeepScanLine>_>
      ::~unique_ptr((unique_ptr<Imf_3_3::CompositeDeepScanLine,_std::default_delete<Imf_3_3::CompositeDeepScanLine>_>
                     *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    }
    std::
    unique_ptr<Imf_3_3::CompositeDeepScanLine,_std::default_delete<Imf_3_3::CompositeDeepScanLine>_>
    ::operator->((unique_ptr<Imf_3_3::CompositeDeepScanLine,_std::default_delete<Imf_3_3::CompositeDeepScanLine>_>
                  *)0x90a4a2);
    CompositeDeepScanLine::setFrameBuffer(in_stack_00000080,in_stack_00000078);
  }
  else {
    std::unique_ptr<Imf_3_3::ScanLineInputFile,_std::default_delete<Imf_3_3::ScanLineInputFile>_>::
    operator->((unique_ptr<Imf_3_3::ScanLineInputFile,_std::default_delete<Imf_3_3::ScanLineInputFile>_>
                *)0x90a4c5);
    ScanLineInputFile::setFrameBuffer(in_stack_000000c0,in_stack_000000b8);
    FrameBuffer::operator=
              ((FrameBuffer *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
               (FrameBuffer *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  }
  return;
}

Assistant:

void
InputFile::Data::lockedSetFrameBuffer (const FrameBuffer& frameBuffer)
{
    if (_storage == EXR_STORAGE_TILED)
    {
        //
        // We must invalidate the cached buffer if the new frame
        // buffer has a different set of channels than the old
        // frame buffer, or if the type of a channel has changed.
        //

        const FrameBuffer& oldFrameBuffer = _cacheFrameBuffer;

        FrameBuffer::ConstIterator i = oldFrameBuffer.begin ();
        FrameBuffer::ConstIterator j = frameBuffer.begin ();

        while (i != oldFrameBuffer.end () && j != frameBuffer.end ())
        {
            if (strcmp (i.name (), j.name ()) ||
                i.slice ().type != j.slice ().type)
                break;

            ++i;
            ++j;
        }

        if (i != oldFrameBuffer.end () || j != frameBuffer.end ())
        {
            //
            // Invalidate the cached buffer.
            //
            deleteCachedBuffer ();

            //
            // Create new a cached frame buffer.  It can hold a single
            // row of tiles.  The cached buffer can be reused for each
            // row of tiles because we set the yTileCoords parameter of
            // each Slice to true.
            //

            _cachedBuffer               = std::make_unique<FrameBuffer> ();
            int              partidx    = getPartIdx ();
            exr_attr_box2i_t dataWindow = _ctxt->dataWindow (partidx);
            _cachedOffset               = dataWindow.min.x;

            uint64_t tileRowSize =
                uint64_t (_tFile->tileYSize ()) *
                (static_cast<uint64_t> (dataWindow.max.x - dataWindow.min.x) +
                 1U);

            for (FrameBuffer::ConstIterator k = frameBuffer.begin ();
                 k != frameBuffer.end ();
                 ++k)
            {
                Slice s = k.slice ();

                //
                // omit adding channels that are not listed - 'fill' channels are added later
                //
                if (_ctxt->hasChannel (partidx, k.name ()))
                {
                    uint64_t bytes = (s.type == OPENEXR_IMF_INTERNAL_NAMESPACE::HALF) ? 2 : 4;
                    uint64_t offset = bytes * _cachedOffset;
                    uint64_t tilebytes = bytes * tileRowSize;

                    _slicePointers.emplace_back (std::make_unique<char[]> (tilebytes));

                    _cachedBuffer->insert (
                        k.name (),
                        Slice (
                            s.type,
                            _slicePointers.back ().get() - offset,
                            bytes,
                            bytes * _tFile->levelWidth (0),
                            1,
                            1,
                            s.fillValue,
                            false,
                            true));
                }
            }
        }

        _cacheFrameBuffer = frameBuffer;
    }
    else if (
        _storage == EXR_STORAGE_DEEP_SCANLINE ||
        _storage == EXR_STORAGE_DEEP_TILED)
    {
        if (!_compositor)
            _compositor = std::make_unique<CompositeDeepScanLine> ();
        _compositor->setFrameBuffer (frameBuffer);
    }
    else
    {
        _sFile->setFrameBuffer (frameBuffer);
        _cacheFrameBuffer = frameBuffer;
    }
}